

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool ModulusSignedCaseHelper<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::SignedCase(SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  rhs,SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *result)

{
  char cVar1;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RSI;
  undefined1 in_DIL;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *unaff_retaddr;
  undefined6 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  cVar1 = ::SafeInt::operator_cast_to_char(in_RSI);
  if (cVar1 == -1) {
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              (unaff_retaddr,
               (int *)CONCAT17(in_stack_ffffffffffffffff,CONCAT16(in_DIL,in_stack_fffffffffffffff8))
              );
  }
  return cVar1 == -1;
}

Assistant:

static bool SignedCase( SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_NOTHROW
    {
        if( (T)rhs == (T)-1 )
        {
            result = 0;
            return true;
        }
        return false;
    }